

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O2

void Mvc_CoverMakeEmpty(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMVar1;
  bool bVar2;
  
  pCube = (pCover->lCubes).pHead;
  if (pCube != (Mvc_Cube_t *)0x0) goto LAB_00704bd9;
  pMVar1 = (Mvc_Cube_t *)0x0;
  while (pCube != (Mvc_Cube_t *)0x0) {
    Mvc_CubeFree(pCover,pCube);
    bVar2 = pMVar1 != (Mvc_Cube_t *)0x0;
    pCube = pMVar1;
    pMVar1 = (Mvc_Cube_t *)0x0;
    if (bVar2) {
LAB_00704bd9:
      pMVar1 = pCube->pNext;
    }
  }
  (pCover->lCubes).pHead = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).pTail = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).nItems = 0;
  return;
}

Assistant:

void Mvc_CoverMakeEmpty( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube, * pCube2;
    Mvc_CoverForEachCubeSafe( pCover, pCube, pCube2 )
        Mvc_CubeFree( pCover, pCube );
    pCover->lCubes.nItems = 0;
    pCover->lCubes.pHead = NULL;
    pCover->lCubes.pTail = NULL;
}